

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O3

void add_ref_mv_candidate
               (MB_MODE_INFO *candidate,MV_REFERENCE_FRAME *rf,uint8_t *refmv_count,
               uint8_t *ref_match_count,uint8_t *newmv_count,CANDIDATE_MV *ref_mv_stack,
               uint16_t *ref_mv_weight,int_mv *gm_mv_candidates,WarpedMotionParams *gm_params,
               uint16_t weight)

{
  int_mv *piVar1;
  int_mv iVar2;
  CANDIDATE_MV CVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  int_mv *piVar7;
  bool bVar8;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  int_mv *piVar13;
  int_mv local_50;
  int_mv aiStack_4c [7];
  int_mv this_refmv [2];
  
  if (((candidate->field_0xa7 & 0x80) != 0) || ('\0' < candidate->ref_frame[0])) {
    if (rf[1] == -1) {
      lVar10 = 0;
      bVar4 = true;
      do {
        bVar8 = bVar4;
        if (candidate->ref_frame[lVar10] == *rf) {
          bVar9 = candidate->mode;
          bVar12 = block_size_high[candidate->bsize];
          if (block_size_wide[candidate->bsize] < block_size_high[candidate->bsize]) {
            bVar12 = block_size_wide[candidate->bsize];
          }
          piVar1 = candidate->mv + lVar10;
          piVar13 = gm_mv_candidates;
          if (bVar12 < 8) {
            piVar13 = piVar1;
          }
          if ((bVar9 - 0xf & 0xf7) != 0) {
            piVar13 = piVar1;
          }
          if (gm_params[candidate->ref_frame[lVar10]].wmtype < 2) {
            piVar13 = piVar1;
          }
          iVar2 = (int_mv)piVar13->as_int;
          bVar12 = *refmv_count;
          uVar6 = (uint)bVar12;
          if ((ulong)bVar12 == 0) {
            bVar12 = 0;
            uVar6 = 0;
          }
          else {
            uVar11 = 0;
            do {
              if (ref_mv_stack[uVar11].this_mv.as_int == iVar2.as_int) {
                ref_mv_weight[uVar11] = ref_mv_weight[uVar11] + weight;
                bVar12 = *refmv_count;
                uVar6 = (uint)uVar11;
                break;
              }
              uVar11 = uVar11 + 1;
            } while (bVar12 != uVar11);
          }
          if (bVar12 < 8 && uVar6 == bVar12) {
            ref_mv_stack[uVar6].this_mv = iVar2;
            ref_mv_weight[uVar6] = weight;
            *refmv_count = *refmv_count + '\x01';
            bVar9 = candidate->mode;
          }
          if ((bVar9 < 0x19) && ((0x1790000U >> (bVar9 & 0x1f) & 1) != 0)) {
            *newmv_count = *newmv_count + '\x01';
          }
          *ref_match_count = *ref_match_count + '\x01';
        }
        lVar10 = 1;
        bVar4 = false;
      } while (bVar8);
    }
    else if ((candidate->ref_frame[0] == *rf) && (candidate->ref_frame[1] == rf[1])) {
      bVar9 = block_size_high[candidate->bsize];
      if (block_size_wide[candidate->bsize] < block_size_high[candidate->bsize]) {
        bVar9 = block_size_wide[candidate->bsize];
      }
      bVar12 = candidate->mode;
      piVar1 = candidate->mv;
      lVar10 = 0;
      piVar13 = &local_50;
      bVar4 = true;
      do {
        bVar8 = bVar4;
        piVar7 = gm_mv_candidates;
        if (bVar9 < 8) {
          piVar7 = piVar1;
        }
        if ((bVar12 - 0xf & 0xf7) != 0) {
          piVar7 = piVar1;
        }
        if (gm_params[rf[lVar10]].wmtype < 2) {
          piVar7 = piVar1;
        }
        *piVar13 = piVar7[lVar10];
        lVar10 = 1;
        piVar13 = aiStack_4c;
        bVar4 = false;
      } while (bVar8);
      uVar11 = (ulong)*refmv_count;
      uVar6 = (uint)*refmv_count;
      if (uVar11 == 0) {
        uVar6 = 0;
        uVar11 = 0;
      }
      else {
        uVar5 = 0;
        do {
          if ((ref_mv_stack[uVar5].this_mv.as_int == local_50.as_int) &&
             (ref_mv_stack[uVar5].comp_mv.as_int == aiStack_4c[0].as_int)) {
            ref_mv_weight[uVar5] = ref_mv_weight[uVar5] + weight;
            uVar6 = (uint)*refmv_count;
            uVar11 = uVar5;
            break;
          }
          uVar5 = uVar5 + 1;
        } while (uVar11 != uVar5);
      }
      if ((byte)uVar6 < 8 && (uint)uVar11 == uVar6) {
        CVar3.comp_mv.as_int = aiStack_4c[0].as_int;
        CVar3.this_mv.as_int = local_50.as_int;
        ref_mv_stack[uVar11 & 0xffffffff] = CVar3;
        ref_mv_weight[uVar11 & 0xffffffff] = weight;
        *refmv_count = *refmv_count + '\x01';
        bVar12 = candidate->mode;
      }
      if ((bVar12 < 0x19) && ((0x1790000U >> (bVar12 & 0x1f) & 1) != 0)) {
        *newmv_count = *newmv_count + '\x01';
      }
      *ref_match_count = *ref_match_count + '\x01';
    }
  }
  return;
}

Assistant:

static inline int is_inter_block(const MB_MODE_INFO *mbmi) {
  return is_intrabc_block(mbmi) || mbmi->ref_frame[0] > INTRA_FRAME;
}